

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

QList<QGesture_*> * __thiscall QGestureEvent::canceledGestures(QGestureEvent *this)

{
  bool bVar1;
  GestureState GVar2;
  const_iterator o;
  QList<QGesture_*> *in_RDI;
  long in_FS_OFFSET;
  QGesture *gesture;
  QList<QGesture_*> *__range1;
  QList<QGesture_*> *gestures;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_ffffffffffffff98;
  QList<QGesture_*> *this_00;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QGesture_*>::QList((QList<QGesture_*> *)0x2fc6c1);
  local_10.i = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QGesture_*>::begin(this_00);
  o = QList<QGesture_*>::end(this_00);
  while (bVar1 = QList<QGesture_*>::const_iterator::operator!=(&local_10,o), bVar1) {
    QList<QGesture_*>::const_iterator::operator*(&local_10);
    GVar2 = QGesture::state((QGesture *)0x2fc74f);
    if (GVar2 == GestureCanceled) {
      QList<QGesture_*>::append((QList<QGesture_*> *)0x2fc763,in_stack_ffffffffffffff98);
    }
    QList<QGesture_*>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QGesture *> QGestureEvent::canceledGestures() const
{
    QList<QGesture *> gestures;
    for (QGesture *gesture : m_gestures) {
        if (gesture->state() == Qt::GestureCanceled)
            gestures.append(gesture);
    }
    return gestures;
}